

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChIntegrable.cpp
# Opt level: O2

bool __thiscall
chrono::ChIntegrableIIorder::StateSolveA
          (ChIntegrableIIorder *this,ChStateDelta *Dvdt,ChVectorDynamic<> *L,ChState *x,
          ChStateDelta *v,double T,double dt,bool force_state_scatter,bool full_update)

{
  int iVar1;
  ulong uVar2;
  undefined7 in_register_00000089;
  ChVectorDynamic<> Qc;
  ChVectorDynamic<> R;
  ChStateDelta dx;
  ChState xdx;
  ChStateDelta local_48;
  
  uVar2 = (ulong)full_update;
  if ((int)CONCAT71(in_register_00000089,force_state_scatter) != 0) {
    (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x17])(T,this,x,v,uVar2);
  }
  dx.super_ChVectorDynamic<double>.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data._0_4_ = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x13])(this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&R,(int *)&dx);
  dx.super_ChVectorDynamic<double>.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data._0_4_ = (*(this->super_ChIntegrable)._vptr_ChIntegrable[2])(this);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&Qc,(int *)&dx);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&R);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&Qc);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0xe])(0x3ff0000000000000,this,&R);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x10])
            (0xc27d1a94a2000000,0x46293e5939a08cea,this,&Qc,0);
  ChStateDelta::ChStateDelta(&dx,v);
  ChStateDelta::operator*=(&dx,1e-06);
  ChState::ChState(&xdx,(x->super_ChVectorDynamic<double>).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows,&this->super_ChIntegrable);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0xb])(this,&xdx,x,&dx);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x17])(T + 1e-06,this,&xdx,v,uVar2);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x10])
            (0x426d1a94a2000000,0x46293e5939a08cea,this,&Qc,0);
  ChStateDelta::operator-(&local_48,&dx);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0xb])(this,&xdx,x,&local_48);
  Eigen::internal::handmade_aligned_free
            (local_48.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x17])(T + -1e-06,this,&xdx,v,uVar2);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x10])
            (0x426d1a94a2000000,0x46293e5939a08cea,this,&Qc,0);
  (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x17])(T,this,x,v,uVar2);
  iVar1 = (*(this->super_ChIntegrable)._vptr_ChIntegrable[0x1c])
                    (0x3ff0000000000000,0,0,T,this,Dvdt,L,&R,&Qc,x,v,0,0,1);
  Eigen::internal::handmade_aligned_free
            (xdx.super_ChVectorDynamic<double>.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            ((void *)CONCAT44(dx.super_ChVectorDynamic<double>.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                              m_storage.m_data._4_4_,
                              (int)dx.super_ChVectorDynamic<double>.
                                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                   m_storage.m_data));
  Eigen::internal::handmade_aligned_free
            (Qc.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  Eigen::internal::handmade_aligned_free
            (R.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return SUB41(iVar1,0);
}

Assistant:

bool ChIntegrableIIorder::StateSolveA(ChStateDelta& Dvdt,        // result: computed a for a=dv/dt
                                      ChVectorDynamic<>& L,      // result: computed lagrangian multipliers, if any
                                      const ChState& x,          // current state, x
                                      const ChStateDelta& v,     // current state, v
                                      const double T,            // current time T
                                      const double dt,           // timestep (if needed)
                                      bool force_state_scatter,  // if false, x and v are not scattered to the system
                                      bool full_update           // if true, perform a full update during scatter
) {
    if (force_state_scatter)
        StateScatter(x, v, T, full_update);

    ChVectorDynamic<> R(GetNcoords_v());
    ChVectorDynamic<> Qc(GetNconstr());
    const double Delta = 1e-6;

    R.setZero();
    Qc.setZero();

    LoadResidual_F(R, 1.0);
    LoadConstraint_C(Qc, -2.0 / (Delta * Delta));

    // numerical differentiation to get the Qc term in constraints
    ChStateDelta dx(v);
    dx *= Delta;
    ChState xdx(x.size(), this);

    StateIncrement(xdx, x, dx);
    StateScatter(xdx, v, T + Delta, full_update);
    LoadConstraint_C(Qc, 1.0 / (Delta * Delta));

    StateIncrement(xdx, x, -dx);
    StateScatter(xdx, v, T - Delta, full_update);
    LoadConstraint_C(Qc, 1.0 / (Delta * Delta));

    StateScatter(x, v, T, full_update);  // back to original state

    bool success = StateSolveCorrection(Dvdt, L, R, Qc, 1.0, 0, 0, x, v, T, false, false, true);

    return success;
}